

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O0

uint AddBodyFixedJoint(Model *model,uint parent_id,SpatialTransform *joint_frame,Joint *joint,
                      Body *body,string *body_name)

{
  bool bVar1;
  uint uVar2;
  mapped_type mVar3;
  size_type sVar4;
  ostream *poVar5;
  undefined8 uVar6;
  long lVar7;
  RBDLError *this;
  string *text;
  mapped_type *pmVar8;
  uint in_ESI;
  long in_RDI;
  string *in_R9;
  ostringstream errormsg_1;
  ostringstream errormsg;
  Body *in_stack_000003b0;
  SpatialTransform *in_stack_000003b8;
  Body *in_stack_000003c0;
  Body parent_body;
  FixedBody fixed_parent;
  FixedBody fbody;
  FixedBody *in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff874;
  value_type *in_stack_fffffffffffff878;
  vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
  *in_stack_fffffffffffff880;
  Model *in_stack_fffffffffffff888;
  RBDLError *in_stack_fffffffffffff890;
  key_type *in_stack_fffffffffffff8a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffff8b0;
  ostringstream local_6e8 [24];
  SpatialTransform *in_stack_fffffffffffff930;
  SpatialTransform *in_stack_fffffffffffff938;
  Matrix3d *in_stack_fffffffffffff9e8;
  Vector3d *in_stack_fffffffffffff9f0;
  Scalar in_stack_fffffffffffff9f8;
  _Self local_570;
  _Self local_568;
  undefined1 local_559;
  ostringstream local_538 [472];
  Body local_360 [2];
  uint local_228;
  uint local_f8;
  uint local_c;
  long local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  RigidBodyDynamics::FixedBody::CreateFromBody((Body *)in_stack_fffffffffffff878);
  local_f8 = local_c;
  RigidBodyDynamics::Math::SpatialTransform::operator=
            ((SpatialTransform *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
             (SpatialTransform *)in_stack_fffffffffffff868);
  bVar1 = RigidBodyDynamics::Model::IsFixedBodyId
                    (in_stack_fffffffffffff888,(uint)((ulong)in_stack_fffffffffffff880 >> 0x20));
  if (bVar1) {
    std::
    vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>::
    operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                *)(local_8 + 0x318),(ulong)(local_c - *(int *)(local_8 + 0x330)));
    RigidBodyDynamics::FixedBody::FixedBody
              ((FixedBody *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
               in_stack_fffffffffffff868);
    local_f8 = local_228;
    RigidBodyDynamics::Math::SpatialTransform::operator*
              (in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    RigidBodyDynamics::Math::SpatialTransform::operator=
              ((SpatialTransform *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
               (SpatialTransform *)in_stack_fffffffffffff868);
  }
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
  operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_8 + 0x338),(ulong)local_f8);
  RigidBodyDynamics::Body::Body
            ((Body *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
             (Body *)in_stack_fffffffffffff868);
  RigidBodyDynamics::Body::Join(in_stack_000003c0,in_stack_000003b8,in_stack_000003b0);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
  operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_8 + 0x338),(ulong)local_f8);
  RigidBodyDynamics::Body::operator=
            ((Body *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
             (Body *)in_stack_fffffffffffff868);
  RigidBodyDynamics::Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                *)(local_8 + 0x288),(ulong)local_f8);
  RigidBodyDynamics::Math::SpatialRigidBodyInertia::operator=
            ((SpatialRigidBodyInertia *)
             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
             (SpatialRigidBodyInertia *)in_stack_fffffffffffff868);
  std::vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
  ::push_back(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  sVar4 = std::
          vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
          ::size((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                  *)(local_8 + 0x318));
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (sVar4 <= uVar2 - *(int *)(local_8 + 0x330)) {
    lVar7 = std::__cxx11::string::size();
    if (lVar7 != 0) {
      local_568._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)in_stack_fffffffffffff868,(key_type *)0x84329a);
      local_570._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)in_stack_fffffffffffff868);
      bVar1 = std::operator!=(&local_568,&local_570);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_6e8);
        poVar5 = std::operator<<((ostream *)local_6e8,"Error: Body with name \'");
        this = (RBDLError *)std::operator<<(poVar5,in_R9);
        text = (string *)std::operator<<((ostream *)this,"\' already exists!");
        std::ostream::operator<<(text,std::endl<char,std::char_traits<char>>);
        uVar6 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        RigidBodyDynamics::Errors::RBDLError::RBDLError(this,text);
        __cxa_throw(uVar6,&RigidBodyDynamics::Errors::RBDLError::typeinfo,
                    RigidBodyDynamics::Errors::RBDLError::~RBDLError);
      }
      sVar4 = std::
              vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              ::size((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                      *)(local_8 + 0x318));
      mVar3 = (int)sVar4 + -1 + *(int *)(local_8 + 0x330);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
      *pmVar8 = mVar3;
    }
    sVar4 = std::
            vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
            ::size((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    *)(local_8 + 0x318));
    uVar2 = ((int)sVar4 + *(int *)(local_8 + 0x330)) - 1;
    RigidBodyDynamics::Body::~Body(local_360);
    return uVar2;
  }
  std::__cxx11::ostringstream::ostringstream(local_538);
  poVar5 = std::operator<<((ostream *)local_538,"Error: cannot add more than ");
  uVar2 = std::numeric_limits<unsigned_int>::max();
  sVar4 = std::
          vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
          ::size((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                  *)(local_8 + 0x318));
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2 - sVar4);
  poVar5 = std::operator<<(poVar5," fixed bodies. You need to modify ");
  poVar5 = std::operator<<(poVar5,"Model::fixed_body_discriminator for this.");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_559 = 1;
  uVar6 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  RigidBodyDynamics::Errors::RBDLError::RBDLError
            (in_stack_fffffffffffff890,(string *)in_stack_fffffffffffff888);
  local_559 = 0;
  __cxa_throw(uVar6,&RigidBodyDynamics::Errors::RBDLError::typeinfo,
              RigidBodyDynamics::Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int AddBodyFixedJoint (
  Model &model,
  const unsigned int parent_id,
  const SpatialTransform &joint_frame,
  const Joint &joint,
  const Body &body,
  std::string body_name)
{
  FixedBody fbody = FixedBody::CreateFromBody (body);
  fbody.mMovableParent = parent_id;
  fbody.mParentTransform = joint_frame;

  if (model.IsFixedBodyId(parent_id)) {
    FixedBody fixed_parent =
      model.mFixedBodies[parent_id - model.fixed_body_discriminator];

    fbody.mMovableParent = fixed_parent.mMovableParent;
    fbody.mParentTransform = joint_frame * fixed_parent.mParentTransform;
  }

  // merge the two bodies
  Body parent_body = model.mBodies[fbody.mMovableParent];
  parent_body.Join (fbody.mParentTransform, body);
  model.mBodies[fbody.mMovableParent] = parent_body;
  model.I[fbody.mMovableParent] =
    SpatialRigidBodyInertia::createFromMassComInertiaC (
      parent_body.mMass,
      parent_body.mCenterOfMass,
      parent_body.mInertia);

  model.mFixedBodies.push_back (fbody);

  if (model.mFixedBodies.size() > std::numeric_limits<unsigned int>::max() -
      model.fixed_body_discriminator) {
    std::ostringstream errormsg;
    errormsg  << "Error: cannot add more than "
              << std::numeric_limits<unsigned int>::max() - model.mFixedBodies.size()
              << " fixed bodies. You need to modify "
              << "Model::fixed_body_discriminator for this."
              << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  if (body_name.size() != 0) {
    if (model.mBodyNameMap.find(body_name) != model.mBodyNameMap.end()) {
      std::ostringstream errormsg;
      errormsg << "Error: Body with name '"
               << body_name
               << "' already exists!"
               << std::endl;
      throw Errors::RBDLError(errormsg.str());
    }
    model.mBodyNameMap[body_name] = model.mFixedBodies.size()
                                    + model.fixed_body_discriminator - 1;
  }

  return model.mFixedBodies.size() + model.fixed_body_discriminator - 1;
}